

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O0

int ini_find_property(ini_t *ini,int section,char *name,int name_length)

{
  int iVar1;
  char *local_48;
  char *other;
  int local_30;
  int c;
  int i;
  int name_length_local;
  char *name_local;
  int section_local;
  ini_t *ini_local;
  
  if ((((ini != (ini_t *)0x0) && (name != (char *)0x0)) && (-1 < section)) &&
     (section < ini->section_count)) {
    c = name_length;
    if (name_length < 1) {
      c = sx_strlen(name);
    }
    other._4_4_ = 0;
    for (local_30 = 0; local_30 < ini->property_capacity; local_30 = local_30 + 1) {
      if (ini->properties[local_30].section == section) {
        if (ini->properties[local_30].name_large == (char *)0x0) {
          local_48 = ini->properties[local_30].name;
        }
        else {
          local_48 = ini->properties[local_30].name_large;
        }
        iVar1 = strncasecmp(name,local_48,(long)c);
        if (iVar1 == 0) {
          return other._4_4_;
        }
        other._4_4_ = other._4_4_ + 1;
      }
    }
  }
  return -1;
}

Assistant:

int ini_find_property( ini_t const* ini, int section, char const* name, int name_length )
    {
    int i;
    int c;

    if( ini && name && section >= 0 && section < ini->section_count)
        {
        if( name_length <= 0 ) name_length = (int) INI_STRLEN( name );
        c = 0;
        for( i = 0; i < ini->property_capacity; ++i )
            {
            if( ini->properties[ i ].section == section )
                {
                char const* const other = 
                    ini->properties[ i ].name_large ? ini->properties[ i ].name_large : ini->properties[ i ].name;
                if( INI_STRNICMP( name, other, name_length ) == 0 )
                    return c;
                ++c;
                }
            }
        }

    return INI_NOT_FOUND;
    }